

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNamespace.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckNamespace(Parser *this,char *name,bool doNotCheckMain)

{
  char *pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long lVar4;
  char *__s;
  size_t pos;
  undefined7 in_register_00000011;
  bool bVar5;
  Error error;
  string nspace;
  string names;
  string nameSpace;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  if ((int)CONCAT71(in_register_00000011,doNotCheckMain) != 0) {
    lVar4 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x1767fa,0);
    if (lVar4 != -1) {
      return false;
    }
    lVar4 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x176800,0);
    if (lVar4 == -1) {
      return false;
    }
  }
  this->m_TestsDone[0x11] = true;
  __s = (char *)operator_new__(0xff);
  snprintf(__s,0xff,"The first namespace of the file should match %s",name);
  pcVar1 = (char *)this->m_TestsDescription[0x11]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0x11),0,pcVar1,(ulong)__s);
  operator_delete__(__s);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  pos = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x176519,0);
  if (pos == 0xffffffffffffffff) {
    local_c8 = (char *)0x0;
    local_c0._M_local_buf[0] = '\0';
    local_d0 = &local_c0;
    local_e8._0_8_ = GetLineNumber(this,0,true);
    local_e8._16_8_ = 0x11;
    local_e8._8_8_ = local_e8._0_8_;
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x176837);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,(value_type *)local_e8);
    local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0 != &local_c0) {
LAB_00152760:
      operator_delete(local_90);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    FindPreviousWord((string *)local_e8,this,pos,false,&local_50);
    iVar3 = std::__cxx11::string::compare(local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar5 = true;
    if (iVar3 == 0) goto LAB_00152768;
    std::__cxx11::string::string((string *)&local_90,name,(allocator *)local_e8);
    FindNextWord_abi_cxx11_(&local_b0,this,pos);
    _Var2._M_p = local_b0._M_dataplus._M_p;
    if ((local_b0._M_string_length == local_88) &&
       ((local_b0._M_string_length == 0 ||
        (iVar3 = bcmp(local_b0._M_dataplus._M_p,local_90,local_b0._M_string_length), iVar3 == 0))))
    {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_b0.field_2) {
        operator_delete(_Var2._M_p);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      goto LAB_00152768;
    }
    local_c8 = (char *)0x0;
    local_c0._M_local_buf[0] = '\0';
    local_d0 = &local_c0;
    local_e8._0_8_ = GetLineNumber(this,pos,true);
    local_e8._16_8_ = 0x11;
    local_e8._8_8_ = local_e8._0_8_;
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x176853);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,(value_type *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0 != &local_c0) {
      operator_delete((void *)local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_90 != &local_80) goto LAB_00152760;
  }
  bVar5 = false;
LAB_00152768:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return bVar5;
}

Assistant:

bool Parser::CheckNamespace(const char* name,bool doNotCheckMain)
{
  // If there is a 'int main' keyword in the file we do not check
  // Or if there is not keyword class
  if(doNotCheckMain)
    {
    if( (m_BufferNoComment.find("main ",0) != std::string::npos)
       || (m_BufferNoComment.find("class ",0) == std::string::npos)
      )
      {
      return false;
      }
    }

  m_TestsDone[NAMESPACE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The first namespace of the file should match %s",name);
  m_TestsDescription[NAMESPACE] = val;
  delete [] val;

  std::string nameSpace = "";

  size_t pos = m_BufferNoComment.find("namespace",0);

  if(pos == std::string::npos)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NAMESPACE;
    error.description = "namespace not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  
  // check that the word is not using namespace
  bool ok = true;
  if(this->FindPreviousWord(pos) == "using")
    {
    ok = false;
    }

  if(ok)
    {
    std::string names = name;
    // extract the namespace
    std::string nspace = this->FindNextWord(pos);
    if(nspace != names)
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = NAMESPACE;
      error.description = "namespace is wrong";
      m_ErrorList.push_back(error);
      return false;
      }
    }

  /*
  // Now search if we have other namespaces
  while(pos!= std::string::npos && ok)
    {
    pos = buffer.find("namespace",pos+1);
    // check that the word is not using namespace
    use = buffer.find("using",pos-20);

    ok = true;

    if((use!=-1 && pos-use<20) || (pos == -1))
      {
      ok = false;
      }

    if(ok)
      {
      // extract the namespace
      long int bracket = buffer.find("{",pos);
      long int closing = FindClosingBracket(buffer,bracket);

      // Find the number of } after closing
      int num = 0;
      int close = closing+1;
      while(buffer.find("}",close) != -1)
        {
        num++;
        close=buffer.find("}",close);
        close++;
        }

      if(bracket != -1 && bracket-pos-10<10 && num==nNameSpace)
        {
        std::string name = buffer.substr(pos+10,bracket-pos-10);
        RemoveCtrlN(name);
        RemoveChar(name,' ');
        RemoveCtrlN(name);
        nameSpace += "::";
        nameSpace += name;
        nNameSpace++;
        }
      }
    }
    */

  return true;
}